

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O3

void R_AddLine(seg_t *line)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  sector_t *other;
  sector_t *this;
  short sVar17;
  short *psVar18;
  bool bVar19;
  int *piVar20;
  uint uVar21;
  vertex_t *pvVar22;
  short *psVar23;
  vertex_t *pvVar24;
  long lVar25;
  int iVar26;
  vertex_t *pvVar27;
  int first;
  line_t *line_00;
  long lVar28;
  ulong uVar29;
  int iVar30;
  double dVar31;
  int iVar33;
  int iVar34;
  undefined1 auVar32 [16];
  int iVar35;
  double dVar36;
  long lVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  int iVar74;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  DVector2 local_78;
  DVector2 local_68;
  DVector2 local_58;
  DVector2 local_48;
  DVector2 local_38;
  
  if (R_AddLine(seg_t*)::tempsec == '\0') {
    R_AddLine();
  }
  dVar36 = ViewPos.Y;
  dVar31 = ViewPos.X;
  dc_color = ((uint)((int)line - (int)segs) >> 3) * -0x38e38e38 & 0xff | 4;
  dVar2 = (line->v1->p).X;
  dVar3 = (line->v1->p).Y;
  local_68.X = dVar2 - ViewPos.X;
  local_68.Y = dVar3 - ViewPos.Y;
  dVar4 = (line->v2->p).X;
  dVar5 = (line->v2->p).Y;
  local_78.X = dVar4 - ViewPos.X;
  local_78.Y = dVar5 - ViewPos.Y;
  if (0.0 <= (dVar2 - dVar4) * local_68.Y + (dVar5 - dVar3) * local_68.X) {
    curline = line;
    return;
  }
  curline = line;
  bVar19 = FWallCoords::Init(&WallC,&local_68,&local_78,0.0078125);
  if (bVar19) {
    return;
  }
  if (WindowRight <= WallC.sx1) {
    return;
  }
  if (WallC.sx2 <= WindowLeft) {
    return;
  }
  line_00 = line->linedef;
  if (line_00 == (line_t *)0x0) {
    psVar18 = &solidsegs[0].last;
    do {
      psVar23 = psVar18;
      psVar18 = psVar23 + 2;
    } while (*psVar23 < WallC.sx1);
    if ((WallC.sx2 <= *psVar23) && (((cliprange_t *)(psVar23 + -1))->first <= WallC.sx1)) {
      return;
    }
  }
  else {
    if (CurrentPortal != (PortalDrawseg *)0x0 && CurrentPortalInSkybox == false) {
      local_38.X = dVar31;
      local_38.Y = dVar36;
      bVar19 = P_ClipLineToPortal(line_00,CurrentPortal->dst,&local_38,true,true);
      if (bVar19) {
        return;
      }
      line_00 = line->linedef;
    }
    pvVar24 = line_00->v1;
    pvVar27 = line_00->v2;
    if (((pvVar24 == line->v1) && (pvVar27 == line->v2)) ||
       ((pvVar27 == line->v1 && (pvVar24 == line->v2)))) {
      FWallTmapVals::InitFromWallCoords(&WallT,&WallC);
    }
    else {
      pvVar22 = pvVar27;
      if (line_00->sidedef[0] == line->sidedef) {
        pvVar22 = pvVar24;
        pvVar24 = pvVar27;
      }
      local_48.X = (pvVar22->p).X - ViewPos.X;
      local_48.Y = (pvVar22->p).Y - ViewPos.Y;
      local_58.X = (pvVar24->p).X - ViewPos.X;
      local_58.Y = (pvVar24->p).Y - ViewPos.Y;
      FWallTmapVals::InitFromLine(&WallT,&local_48,&local_58);
    }
    if ((fake3D & 4U) == 0) {
      backsector = line->backsector;
    }
    pvVar24 = line->v1;
    dVar2 = (frontsector->ceilingplane).D;
    dVar6 = (frontsector->ceilingplane).normal.X;
    dVar7 = (frontsector->ceilingplane).normal.Y;
    dVar31 = (pvVar24->p).Y;
    dVar3 = (frontsector->ceilingplane).negiC;
    rw_frontcz1 = (dVar31 * dVar7 + (pvVar24->p).X * dVar6 + dVar2) * dVar3;
    dVar4 = (frontsector->floorplane).D;
    dVar8 = (frontsector->floorplane).normal.X;
    dVar9 = (frontsector->floorplane).normal.Y;
    dVar5 = (frontsector->floorplane).negiC;
    rw_frontfz1 = (dVar31 * dVar9 + (pvVar24->p).X * dVar8 + dVar4) * dVar5;
    pvVar27 = line->v2;
    dVar36 = (pvVar27->p).Y;
    rw_frontcz2 = (dVar7 * dVar36 + dVar2 + dVar6 * (pvVar27->p).X) * dVar3;
    rw_frontfz2 = (dVar36 * dVar9 + dVar4 + (pvVar27->p).X * dVar8) * dVar5;
    rw_mustmarkceiling = false;
    rw_mustmarkfloor = false;
    rw_havelow = false;
    rw_havehigh = false;
    bVar19 = true;
    if (backsector != (sector_t *)0x0) {
      if ((fake3D & 4U) == 0) {
        backsector = R_FakeFlat(backsector,&R_AddLine::tempsec,(int *)0x0,(int *)0x0,true);
        pvVar24 = line->v1;
        pvVar27 = line->v2;
        dVar31 = (pvVar24->p).Y;
        dVar36 = (pvVar27->p).Y;
      }
      doorclosed = 0;
      dVar2 = (backsector->ceilingplane).D;
      dVar3 = (backsector->ceilingplane).normal.X;
      dVar4 = (backsector->ceilingplane).normal.Y;
      dVar5 = (backsector->ceilingplane).negiC;
      rw_backcz1 = (dVar31 * dVar4 + (pvVar24->p).X * dVar3 + dVar2) * dVar5;
      dVar6 = (backsector->floorplane).D;
      dVar7 = (backsector->floorplane).normal.X;
      dVar8 = (backsector->floorplane).normal.Y;
      dVar9 = (backsector->floorplane).negiC;
      rw_backfz1 = (dVar31 * dVar8 + (pvVar24->p).X * dVar7 + dVar6) * dVar9;
      rw_backcz2 = (dVar4 * dVar36 + dVar3 * (pvVar27->p).X + dVar2) * dVar5;
      rw_backfz2 = (dVar36 * dVar8 + dVar6 + dVar7 * (pvVar27->p).X) * dVar9;
      if ((fake3D & 4U) != 0) {
        if ((rw_backfz1 <= rw_frontfz1) && (rw_backfz2 <= rw_frontfz2)) {
          fake3D = fake3D | 8;
        }
        if ((rw_frontcz1 <= rw_backcz1) && (rw_frontcz2 <= rw_backcz2)) {
          fake3D = fake3D | 0x10;
        }
      }
      if ((rw_backcz1 < rw_frontcz1) || (rw_backcz2 < rw_frontcz2)) {
        rw_havehigh = true;
        WallMost(wallupper,&backsector->ceilingplane,&WallC);
      }
      if ((rw_frontfz1 < rw_backfz1) || (rw_frontfz2 < rw_backfz2)) {
        rw_havelow = true;
        WallMost(walllower,&backsector->floorplane,&WallC);
      }
      this = backsector;
      other = frontsector;
      uVar21 = line->linedef->portalindex;
      if (((((linePortals.Count <= uVar21) || ((linePortals.Array[uVar21].mFlags & 1) == 0)) ||
           (line->sidedef != line->linedef->sidedef[0])) &&
          ((rw_frontfz1 < rw_backcz1 || (rw_frontfz2 < rw_backcz2)))) &&
         ((rw_backfz1 < rw_frontcz1 || (rw_backfz2 < rw_frontcz2)))) {
        iVar69 = backsector->planes[1].Texture.texnum;
        if (((((iVar69 == skyflatnum.texnum) && (frontsector->planes[1].Texture.texnum == iVar69))
             || (rw_backfz1 < rw_backcz1)) ||
            ((rw_backfz2 < rw_backcz2 ||
             (((rw_backcz1 < rw_frontcz1 || (rw_backcz2 < rw_frontcz2)) &&
              (line->sidedef->textures[0].texture.texnum < 1)))))) ||
           (((rw_frontfz1 < rw_backfz1 || (rw_frontfz2 < rw_backfz2)) &&
            (line->sidedef->textures[2].texture.texnum < 1)))) {
          if (((frontsector->ceilingplane).normal.X == (backsector->ceilingplane).normal.X) &&
             ((frontsector->ceilingplane).normal.Y == (backsector->ceilingplane).normal.Y)) {
            bVar19 = false;
            if (((frontsector->ceilingplane).normal.Z != (backsector->ceilingplane).normal.Z) ||
               ((frontsector->ceilingplane).D != (backsector->ceilingplane).D)) goto LAB_002fe2e1;
            if (((frontsector->floorplane).normal.X == (backsector->floorplane).normal.X) &&
               ((frontsector->floorplane).normal.Y == (backsector->floorplane).normal.Y)) {
              bVar19 = false;
              if (((frontsector->floorplane).normal.Z != (backsector->floorplane).normal.Z) ||
                 (bVar19 = false, (frontsector->floorplane).D != (backsector->floorplane).D))
              goto LAB_002fe2e1;
              bVar19 = R_SkyboxCompare(frontsector,backsector);
              if ((((((!bVar19) && (this->lightlevel == other->lightlevel)) &&
                    (this->planes[0].Texture.texnum == other->planes[0].Texture.texnum)) &&
                   (((iVar69 == other->planes[1].Texture.texnum &&
                     (curline->sidedef->textures[1].texture.texnum < 1)) &&
                    ((bVar19 = FTransform::operator!=((FTransform *)this,(FTransform *)other),
                     !bVar19 &&
                     ((bVar19 = FTransform::operator!=
                                          (&backsector->planes[1].xform,
                                           &frontsector->planes[1].xform), !bVar19 &&
                      (backsector->planes[0].Light == frontsector->planes[0].Light)))))))) &&
                  (backsector->planes[1].Light == frontsector->planes[1].Light)) &&
                 (((((((frontsector->planes[0].Flags ^ backsector->planes[0].Flags) & 0xfffffecdU)
                      == 0 && (((frontsector->planes[1].Flags ^ backsector->planes[1].Flags) &
                               0xfffffecdU) == 0)) &&
                    (backsector->ColorMap == frontsector->ColorMap)) &&
                   ((frontsector->e == (extsector_t *)0x0 ||
                    ((frontsector->e->XFloor).lightlist.Count == 0)))) &&
                  ((backsector->e == (extsector_t *)0x0 ||
                   ((backsector->e->XFloor).lightlist.Count == 0)))))) {
                if (hasglnodes != true) {
                  return;
                }
                uVar21 = InSubsector->flags;
                if ((uVar21 & 2) != 0) {
                  return;
                }
                piVar20 = &InSubsector->flags;
                psVar18 = &solidsegs[0].last;
                do {
                  psVar23 = psVar18;
                  psVar18 = psVar23 + 2;
                } while (*psVar23 < WallC.sx1);
                if ((WallC.sx2 <= *psVar23) && (((cliprange_t *)(psVar23 + -1))->first <= WallC.sx1)
                   ) {
                  return;
                }
                goto LAB_002fe8fb;
              }
            }
          }
          bVar19 = false;
        }
        else {
          doorclosed = 1;
        }
      }
    }
LAB_002fe2e1:
    sVar17 = (short)centery;
    auVar16 = _DAT_0073b300;
    rw_prepped = false;
    if (line->linedef->special == 9) {
      first = (int)WallC.sx1;
      iVar26 = (int)WallC.sx2;
      iVar69 = first;
      if (WallC.sx2 != WallC.sx1) {
        lVar25 = (long)first;
        uVar29 = (ulong)(uint)(iVar26 - first);
        uVar1 = uVar29 + 7;
        lVar28 = uVar29 - 1;
        auVar32._8_4_ = (int)lVar28;
        auVar32._0_8_ = lVar28;
        auVar32._12_4_ = (int)((ulong)lVar28 >> 0x20);
        lVar28 = lVar25 * 2;
        uVar29 = 0;
        auVar32 = auVar32 ^ _DAT_0073b300;
        auVar51 = _DAT_0073c180;
        auVar77 = _DAT_0073c190;
        auVar81 = _DAT_0073c1a0;
        auVar55 = _DAT_0073b2f0;
        do {
          auVar42 = auVar55 ^ auVar16;
          iVar30 = auVar32._0_4_;
          iVar69 = -(uint)(iVar30 < auVar42._0_4_);
          iVar33 = auVar32._4_4_;
          auVar43._4_4_ = -(uint)(iVar33 < auVar42._4_4_);
          iVar34 = auVar32._8_4_;
          iVar74 = -(uint)(iVar34 < auVar42._8_4_);
          iVar35 = auVar32._12_4_;
          auVar43._12_4_ = -(uint)(iVar35 < auVar42._12_4_);
          auVar62._4_4_ = iVar69;
          auVar62._0_4_ = iVar69;
          auVar62._8_4_ = iVar74;
          auVar62._12_4_ = iVar74;
          auVar75 = pshuflw(in_XMM11,auVar62,0xe8);
          auVar45._4_4_ = -(uint)(auVar42._4_4_ == iVar33);
          auVar45._12_4_ = -(uint)(auVar42._12_4_ == iVar35);
          auVar45._0_4_ = auVar45._4_4_;
          auVar45._8_4_ = auVar45._12_4_;
          auVar80 = pshuflw(in_XMM12,auVar45,0xe8);
          auVar43._0_4_ = auVar43._4_4_;
          auVar43._8_4_ = auVar43._12_4_;
          auVar76 = pshuflw(auVar75,auVar43,0xe8);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar42 = (auVar76 | auVar80 & auVar75) ^ auVar42;
          auVar42 = packssdw(auVar42,auVar42);
          if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            walltop[lVar25 + uVar29] = sVar17;
          }
          auVar43 = auVar45 & auVar62 | auVar43;
          auVar42 = packssdw(auVar43,auVar43);
          auVar76._8_4_ = 0xffffffff;
          auVar76._0_8_ = 0xffffffffffffffff;
          auVar76._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar76,auVar42 ^ auVar76);
          if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
            *(short *)(lVar28 + 0x902d62 + uVar29 * 2) = sVar17;
          }
          auVar42 = auVar81 ^ auVar16;
          iVar69 = -(uint)(iVar30 < auVar42._0_4_);
          auVar70._4_4_ = -(uint)(iVar33 < auVar42._4_4_);
          iVar74 = -(uint)(iVar34 < auVar42._8_4_);
          auVar70._12_4_ = -(uint)(iVar35 < auVar42._12_4_);
          auVar44._4_4_ = iVar69;
          auVar44._0_4_ = iVar69;
          auVar44._8_4_ = iVar74;
          auVar44._12_4_ = iVar74;
          auVar61._4_4_ = -(uint)(auVar42._4_4_ == iVar33);
          auVar61._12_4_ = -(uint)(auVar42._12_4_ == iVar35);
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar42 = auVar61 & auVar44 | auVar70;
          auVar42 = packssdw(auVar42,auVar42);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar10,auVar42 ^ auVar10);
          if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x902d64 + uVar29 * 2) = sVar17;
          }
          auVar45 = pshufhw(auVar44,auVar44,0x84);
          auVar62 = pshufhw(auVar61,auVar61,0x84);
          auVar43 = pshufhw(auVar45,auVar70,0x84);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar43 | auVar62 & auVar45) ^ auVar46;
          auVar45 = packssdw(auVar46,auVar46);
          if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x902d66 + uVar29 * 2) = sVar17;
          }
          auVar45 = auVar77 ^ auVar16;
          iVar69 = -(uint)(iVar30 < auVar45._0_4_);
          auVar48._4_4_ = -(uint)(iVar33 < auVar45._4_4_);
          iVar74 = -(uint)(iVar34 < auVar45._8_4_);
          auVar48._12_4_ = -(uint)(iVar35 < auVar45._12_4_);
          auVar63._4_4_ = iVar69;
          auVar63._0_4_ = iVar69;
          auVar63._8_4_ = iVar74;
          auVar63._12_4_ = iVar74;
          auVar42 = pshuflw(auVar42,auVar63,0xe8);
          auVar47._4_4_ = -(uint)(auVar45._4_4_ == iVar33);
          auVar47._12_4_ = -(uint)(auVar45._12_4_ == iVar35);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          in_XMM12 = pshuflw(auVar80 & auVar75,auVar47,0xe8);
          in_XMM12 = in_XMM12 & auVar42;
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar42 = pshuflw(auVar42,auVar48,0xe8);
          auVar75._8_4_ = 0xffffffff;
          auVar75._0_8_ = 0xffffffffffffffff;
          auVar75._12_4_ = 0xffffffff;
          auVar75 = (auVar42 | in_XMM12) ^ auVar75;
          auVar42 = packssdw(auVar75,auVar75);
          if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x902d68 + uVar29 * 2) = sVar17;
          }
          auVar48 = auVar47 & auVar63 | auVar48;
          auVar42 = packssdw(auVar48,auVar48);
          auVar80._8_4_ = 0xffffffff;
          auVar80._0_8_ = 0xffffffffffffffff;
          auVar80._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar80,auVar42 ^ auVar80);
          if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x902d6a + uVar29 * 2) = sVar17;
          }
          auVar42 = auVar51 ^ auVar16;
          iVar69 = -(uint)(iVar30 < auVar42._0_4_);
          auVar71._4_4_ = -(uint)(iVar33 < auVar42._4_4_);
          iVar74 = -(uint)(iVar34 < auVar42._8_4_);
          auVar71._12_4_ = -(uint)(iVar35 < auVar42._12_4_);
          auVar49._4_4_ = iVar69;
          auVar49._0_4_ = iVar69;
          auVar49._8_4_ = iVar74;
          auVar49._12_4_ = iVar74;
          auVar64._4_4_ = -(uint)(auVar42._4_4_ == iVar33);
          auVar64._12_4_ = -(uint)(auVar42._12_4_ == iVar35);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar42 = auVar64 & auVar49 | auVar71;
          auVar42 = packssdw(auVar42,auVar42);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          in_XMM11 = packssdw(auVar42 ^ auVar11,auVar42 ^ auVar11);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x902d6c + uVar29 * 2) = sVar17;
          }
          auVar42 = pshufhw(auVar49,auVar49,0x84);
          auVar43 = pshufhw(auVar64,auVar64,0x84);
          auVar45 = pshufhw(auVar42,auVar71,0x84);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar45 | auVar43 & auVar42) ^ auVar50;
          auVar42 = packssdw(auVar50,auVar50);
          if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x902d6e + uVar29 * 2) = sVar17;
          }
          uVar29 = uVar29 + 8;
          lVar38 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + 8;
          auVar55._8_8_ = lVar38 + 8;
          lVar38 = auVar81._8_8_;
          auVar81._0_8_ = auVar81._0_8_ + 8;
          auVar81._8_8_ = lVar38 + 8;
          lVar38 = auVar77._8_8_;
          auVar77._0_8_ = auVar77._0_8_ + 8;
          auVar77._8_8_ = lVar38 + 8;
          lVar38 = auVar51._8_8_;
          auVar51._0_8_ = auVar51._0_8_ + 8;
          auVar51._8_8_ = lVar38 + 8;
        } while ((uVar1 & 0xfffffffffffffff8) != uVar29);
        lVar28 = lVar25 * 2;
        uVar29 = 0;
        auVar37 = _DAT_0073c180;
        auVar39 = _DAT_0073c190;
        auVar40 = _DAT_0073c1a0;
        auVar41 = _DAT_0073b2f0;
        do {
          auVar51 = auVar41 ^ auVar16;
          iVar69 = -(uint)(iVar30 < auVar51._0_4_);
          auVar53._4_4_ = -(uint)(iVar33 < auVar51._4_4_);
          iVar74 = -(uint)(iVar34 < auVar51._8_4_);
          auVar53._12_4_ = -(uint)(iVar35 < auVar51._12_4_);
          auVar65._4_4_ = iVar69;
          auVar65._0_4_ = iVar69;
          auVar65._8_4_ = iVar74;
          auVar65._12_4_ = iVar74;
          auVar77 = pshuflw(in_XMM11,auVar65,0xe8);
          auVar52._4_4_ = -(uint)(auVar51._4_4_ == iVar33);
          auVar52._12_4_ = -(uint)(auVar51._12_4_ == iVar35);
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          auVar81 = pshuflw(in_XMM12,auVar52,0xe8);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar51 = pshuflw(auVar77,auVar53,0xe8);
          auVar78._8_4_ = 0xffffffff;
          auVar78._0_8_ = 0xffffffffffffffff;
          auVar78._12_4_ = 0xffffffff;
          auVar78 = (auVar51 | auVar81 & auVar77) ^ auVar78;
          auVar51 = packssdw(auVar78,auVar78);
          if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            wallbottom[lVar25 + uVar29] = sVar17;
          }
          auVar53 = auVar52 & auVar65 | auVar53;
          auVar51 = packssdw(auVar53,auVar53);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar12,auVar51 ^ auVar12);
          if ((auVar51._0_4_ >> 0x10 & 1) != 0) {
            *(short *)(lVar28 + 0x905a62 + uVar29 * 2) = sVar17;
          }
          auVar51 = auVar40 ^ auVar16;
          iVar69 = -(uint)(iVar30 < auVar51._0_4_);
          auVar72._4_4_ = -(uint)(iVar33 < auVar51._4_4_);
          iVar74 = -(uint)(iVar34 < auVar51._8_4_);
          auVar72._12_4_ = -(uint)(iVar35 < auVar51._12_4_);
          auVar54._4_4_ = iVar69;
          auVar54._0_4_ = iVar69;
          auVar54._8_4_ = iVar74;
          auVar54._12_4_ = iVar74;
          auVar66._4_4_ = -(uint)(auVar51._4_4_ == iVar33);
          auVar66._12_4_ = -(uint)(auVar51._12_4_ == iVar35);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar51 = auVar66 & auVar54 | auVar72;
          auVar51 = packssdw(auVar51,auVar51);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar13,auVar51 ^ auVar13);
          if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x905a64 + uVar29 * 2) = sVar17;
          }
          auVar55 = pshufhw(auVar54,auVar54,0x84);
          auVar42 = pshufhw(auVar66,auVar66,0x84);
          auVar32 = pshufhw(auVar55,auVar72,0x84);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar32 | auVar42 & auVar55) ^ auVar56;
          auVar55 = packssdw(auVar56,auVar56);
          if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x905a66 + uVar29 * 2) = sVar17;
          }
          auVar55 = auVar39 ^ auVar16;
          iVar69 = -(uint)(iVar30 < auVar55._0_4_);
          auVar58._4_4_ = -(uint)(iVar33 < auVar55._4_4_);
          iVar74 = -(uint)(iVar34 < auVar55._8_4_);
          auVar58._12_4_ = -(uint)(iVar35 < auVar55._12_4_);
          auVar67._4_4_ = iVar69;
          auVar67._0_4_ = iVar69;
          auVar67._8_4_ = iVar74;
          auVar67._12_4_ = iVar74;
          auVar51 = pshuflw(auVar51,auVar67,0xe8);
          auVar57._4_4_ = -(uint)(auVar55._4_4_ == iVar33);
          auVar57._12_4_ = -(uint)(auVar55._12_4_ == iVar35);
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          in_XMM12 = pshuflw(auVar81 & auVar77,auVar57,0xe8);
          in_XMM12 = in_XMM12 & auVar51;
          auVar58._0_4_ = auVar58._4_4_;
          auVar58._8_4_ = auVar58._12_4_;
          auVar51 = pshuflw(auVar51,auVar58,0xe8);
          auVar79._8_4_ = 0xffffffff;
          auVar79._0_8_ = 0xffffffffffffffff;
          auVar79._12_4_ = 0xffffffff;
          auVar79 = (auVar51 | in_XMM12) ^ auVar79;
          auVar51 = packssdw(auVar79,auVar79);
          if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x905a68 + uVar29 * 2) = sVar17;
          }
          auVar58 = auVar57 & auVar67 | auVar58;
          auVar51 = packssdw(auVar58,auVar58);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar14,auVar51 ^ auVar14);
          if ((auVar51 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x905a6a + uVar29 * 2) = sVar17;
          }
          auVar51 = auVar37 ^ auVar16;
          iVar69 = -(uint)(iVar30 < auVar51._0_4_);
          auVar73._4_4_ = -(uint)(iVar33 < auVar51._4_4_);
          iVar74 = -(uint)(iVar34 < auVar51._8_4_);
          auVar73._12_4_ = -(uint)(iVar35 < auVar51._12_4_);
          auVar59._4_4_ = iVar69;
          auVar59._0_4_ = iVar69;
          auVar59._8_4_ = iVar74;
          auVar59._12_4_ = iVar74;
          auVar68._4_4_ = -(uint)(auVar51._4_4_ == iVar33);
          auVar68._12_4_ = -(uint)(auVar51._12_4_ == iVar35);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar51 = auVar68 & auVar59 | auVar73;
          auVar51 = packssdw(auVar51,auVar51);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          in_XMM11 = packssdw(auVar51 ^ auVar15,auVar51 ^ auVar15);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x905a6c + uVar29 * 2) = sVar17;
          }
          auVar51 = pshufhw(auVar59,auVar59,0x84);
          auVar81 = pshufhw(auVar68,auVar68,0x84);
          auVar77 = pshufhw(auVar51,auVar73,0x84);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar60 = (auVar77 | auVar81 & auVar51) ^ auVar60;
          auVar51 = packssdw(auVar60,auVar60);
          if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(lVar28 + 0x905a6e + uVar29 * 2) = sVar17;
          }
          uVar29 = uVar29 + 8;
          lVar38 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 8;
          auVar41._8_8_ = lVar38 + 8;
          lVar38 = auVar40._8_8_;
          auVar40._0_8_ = auVar40._0_8_ + 8;
          auVar40._8_8_ = lVar38 + 8;
          lVar38 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 8;
          auVar39._8_8_ = lVar38 + 8;
          lVar38 = auVar37._8_8_;
          auVar37._0_8_ = auVar37._0_8_ + 8;
          auVar37._8_8_ = lVar38 + 8;
          iVar69 = iVar26;
        } while ((uVar1 & 0x1fffffff8) != uVar29);
      }
    }
    else {
      rw_ceilstat = WallMost(walltop,&frontsector->ceilingplane,&WallC);
      rw_floorstat = WallMost(wallbottom,&frontsector->floorplane,&WallC);
      first = (int)WallC.sx1;
      iVar69 = (int)WallC.sx2;
    }
    bVar19 = R_ClipWallSegment(first,iVar69,bVar19);
    if (!bVar19) {
      return;
    }
  }
  uVar21 = InSubsector->flags;
  piVar20 = &InSubsector->flags;
LAB_002fe8fb:
  *piVar20 = uVar21 | 2;
  return;
}

Assistant:

void R_AddLine (seg_t *line)
{
	static sector_t tempsec;	// killough 3/8/98: ceiling/water hack
	bool			solid;
	DVector2		pt1, pt2;

	curline = line;

	// [RH] Color if not texturing line
	dc_color = (((int)(line - segs) * 8) + 4) & 255;

	pt1 = line->v1->fPos() - ViewPos;
	pt2 = line->v2->fPos() - ViewPos;

	// Reject lines not facing viewer
	if (pt1.Y * (pt1.X - pt2.X) + pt1.X * (pt2.Y - pt1.Y) >= 0)
		return;

	if (WallC.Init(pt1, pt2, 32.0 / (1 << 12)))
		return;

	if (WallC.sx1 >= WindowRight || WallC.sx2 <= WindowLeft)
		return;

	if (line->linedef == NULL)
	{
		if (R_CheckClipWallSegment (WallC.sx1, WallC.sx2))
		{
			InSubsector->flags |= SSECF_DRAWN;
		}
		return;
	}

	// reject lines that aren't seen from the portal (if any)
	// [ZZ] 10.01.2016: lines inside a skybox shouldn't be clipped, although this imposes some limitations on portals in skyboxes.
	if (!CurrentPortalInSkybox && CurrentPortal && P_ClipLineToPortal(line->linedef, CurrentPortal->dst, ViewPos))
		return;

	vertex_t *v1, *v2;
	v1 = line->linedef->v1;
	v2 = line->linedef->v2;

	if ((v1 == line->v1 && v2 == line->v2) || (v2 == line->v1 && v1 == line->v2))
	{ // The seg is the entire wall.
		WallT.InitFromWallCoords(&WallC);
	}
	else
	{ // The seg is only part of the wall.
		if (line->linedef->sidedef[0] != line->sidedef)
		{
			swapvalues (v1, v2);
		}
		WallT.InitFromLine(v1->fPos() - ViewPos, v2->fPos() - ViewPos);
	}

	if (!(fake3D & FAKE3D_FAKEBACK))
	{
		backsector = line->backsector;
	}
	rw_frontcz1 = frontsector->ceilingplane.ZatPoint(line->v1);
	rw_frontfz1 = frontsector->floorplane.ZatPoint(line->v1);
	rw_frontcz2 = frontsector->ceilingplane.ZatPoint(line->v2);
	rw_frontfz2 = frontsector->floorplane.ZatPoint(line->v2);

	rw_mustmarkfloor = rw_mustmarkceiling = false;
	rw_havehigh = rw_havelow = false;

	// Single sided line?
	if (backsector == NULL)
	{
		solid = true;
	}
	else
	{
		// kg3D - its fake, no transfer_heights
		if (!(fake3D & FAKE3D_FAKEBACK))
		{ // killough 3/8/98, 4/4/98: hack for invisible ceilings / deep water
			backsector = R_FakeFlat (backsector, &tempsec, NULL, NULL, true);
		}
		doorclosed = 0;		// killough 4/16/98

		rw_backcz1 = backsector->ceilingplane.ZatPoint(line->v1);
		rw_backfz1 = backsector->floorplane.ZatPoint(line->v1);
		rw_backcz2 = backsector->ceilingplane.ZatPoint(line->v2);
		rw_backfz2 = backsector->floorplane.ZatPoint(line->v2);

		if (fake3D & FAKE3D_FAKEBACK)
		{
			if (rw_frontfz1 >= rw_backfz1 && rw_frontfz2 >= rw_backfz2)
			{
				fake3D |= FAKE3D_CLIPBOTFRONT;
			}
			if (rw_frontcz1 <= rw_backcz1 && rw_frontcz2 <= rw_backcz2)
			{
				fake3D |= FAKE3D_CLIPTOPFRONT;
			}
		}

		// Cannot make these walls solid, because it can result in
		// sprite clipping problems for sprites near the wall
		if (rw_frontcz1 > rw_backcz1 || rw_frontcz2 > rw_backcz2)
		{
			rw_havehigh = true;
			WallMost (wallupper, backsector->ceilingplane, &WallC);
		}
		if (rw_frontfz1 < rw_backfz1 || rw_frontfz2 < rw_backfz2)
		{
			rw_havelow = true;
			WallMost (walllower, backsector->floorplane, &WallC);
		}

		// Portal
		if (line->linedef->isVisualPortal() && line->sidedef == line->linedef->sidedef[0])
		{
			solid = true;
		}
		// Closed door.
		else if ((rw_backcz1 <= rw_frontfz1 && rw_backcz2 <= rw_frontfz2) ||
				 (rw_backfz1 >= rw_frontcz1 && rw_backfz2 >= rw_frontcz2))
		{
			solid = true;
		}
		else if (
		// properly render skies (consider door "open" if both ceilings are sky):
		(backsector->GetTexture(sector_t::ceiling) != skyflatnum || frontsector->GetTexture(sector_t::ceiling) != skyflatnum)

		// if door is closed because back is shut:
		&& rw_backcz1 <= rw_backfz1 && rw_backcz2 <= rw_backfz2

		// preserve a kind of transparent door/lift special effect:
		&& ((rw_backcz1 >= rw_frontcz1 && rw_backcz2 >= rw_frontcz2) || line->sidedef->GetTexture(side_t::top).isValid())
		&& ((rw_backfz1 <= rw_frontfz1 && rw_backfz2 <= rw_frontfz2) || line->sidedef->GetTexture(side_t::bottom).isValid()))
		{
		// killough 1/18/98 -- This function is used to fix the automap bug which
		// showed lines behind closed doors simply because the door had a dropoff.
		//
		// It assumes that Doom has already ruled out a door being closed because
		// of front-back closure (e.g. front floor is taller than back ceiling).

		// This fixes the automap floor height bug -- killough 1/18/98:
		// killough 4/7/98: optimize: save result in doorclosed for use in r_segs.c
			doorclosed = true;
			solid = true;
		}
		else if (frontsector->ceilingplane != backsector->ceilingplane ||
			frontsector->floorplane != backsector->floorplane)
		{
		// Window.
			solid = false;
		}
		else if (R_SkyboxCompare(frontsector, backsector))
		{
			solid = false;
		}
		else if (backsector->lightlevel != frontsector->lightlevel
			|| backsector->GetTexture(sector_t::floor) != frontsector->GetTexture(sector_t::floor)
			|| backsector->GetTexture(sector_t::ceiling) != frontsector->GetTexture(sector_t::ceiling)
			|| curline->sidedef->GetTexture(side_t::mid).isValid()

			// killough 3/7/98: Take flats offsets into account:
			|| backsector->planes[sector_t::floor].xform != frontsector->planes[sector_t::floor].xform
			|| backsector->planes[sector_t::ceiling].xform != frontsector->planes[sector_t::ceiling].xform

			|| backsector->GetPlaneLight(sector_t::floor) != frontsector->GetPlaneLight(sector_t::floor)
			|| backsector->GetPlaneLight(sector_t::ceiling) != frontsector->GetPlaneLight(sector_t::ceiling)
			|| backsector->GetVisFlags(sector_t::floor) != frontsector->GetVisFlags(sector_t::floor)
			|| backsector->GetVisFlags(sector_t::ceiling) != frontsector->GetVisFlags(sector_t::ceiling)

			// [RH] Also consider colormaps
			|| backsector->ColorMap != frontsector->ColorMap



			// kg3D - and fake lights
			|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
			|| (backsector->e && backsector->e->XFloor.lightlist.Size())
			)
		{
			solid = false;
		}
		else
		{
			// Reject empty lines used for triggers and special events.
			// Identical floor and ceiling on both sides, identical light levels
			// on both sides, and no middle texture.

			// When using GL nodes, do a clipping test for these lines so we can
			// mark their subsectors as visible for automap texturing.
			if (hasglnodes && !(InSubsector->flags & SSECF_DRAWN))
			{
				if (R_CheckClipWallSegment(WallC.sx1, WallC.sx2))
				{
					InSubsector->flags |= SSECF_DRAWN;
				}
			}
			return;
		}
	}

	rw_prepped = false;

	if (line->linedef->special == Line_Horizon)
	{
		// Be aware: Line_Horizon does not work properly with sloped planes
		clearbufshort (walltop+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
		clearbufshort (wallbottom+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
	}
	else
	{
		rw_ceilstat = WallMost (walltop, frontsector->ceilingplane, &WallC);
		rw_floorstat = WallMost (wallbottom, frontsector->floorplane, &WallC);

		// [RH] treat off-screen walls as solid
#if 0	// Maybe later...
		if (!solid)
		{
			if (rw_ceilstat == 12 && line->sidedef->GetTexture(side_t::top) != 0)
			{
				rw_mustmarkceiling = true;
				solid = true;
			}
			if (rw_floorstat == 3 && line->sidedef->GetTexture(side_t::bottom) != 0)
			{
				rw_mustmarkfloor = true;
				solid = true;
			}
		}
#endif
	}

	if (R_ClipWallSegment (WallC.sx1, WallC.sx2, solid))
	{
		InSubsector->flags |= SSECF_DRAWN;
	}
}